

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int qtree_encode(char *outfile,int *a,int n,int nqx,int nqy,int nbitplanes)

{
  int iVar1;
  int iVar2;
  uchar *b_00;
  uchar *buffer_00;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  int *a_00;
  double dVar3;
  uchar *buffer;
  uchar *scratch;
  int ny;
  int nx;
  int nqy2;
  int nqx2;
  int nqmax;
  int bmax;
  int b;
  int bit;
  int k;
  int i;
  int log2n;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  int local_54;
  int local_50;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  char *local_10;
  int local_4;
  
  iVar1 = in_R8D;
  if (in_R8D < in_ECX) {
    iVar1 = in_ECX;
  }
  iVar4 = iVar1;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  a_00 = (int *)log((double)iVar1);
  dVar3 = log(2.0);
  local_2c = (int)((double)a_00 / dVar3 + 0.5);
  if (1 << ((byte)local_2c & 0x1f) < iVar1) {
    local_2c = local_2c + 1;
  }
  iVar1 = (((local_20 + 1) / 2) * ((local_24 + 1) / 2) + 1) / 2;
  b_00 = (uchar *)malloc((long)(iVar1 << 1));
  buffer_00 = (uchar *)malloc((long)iVar1);
  if ((b_00 == (uchar *)0x0) || (buffer_00 == (uchar *)0x0)) {
    ffpmsg((char *)0x2640d6);
    local_4 = 0x19d;
  }
  else {
LAB_002640f1:
    local_38 = local_28 + -1;
    if (-1 < local_38) {
      local_3c = 0;
      bitbuffer = 0;
      bits_to_go3 = 0;
      qtree_onebit(local_18,local_1c,local_20,local_24,b_00,local_38);
      local_50 = local_20 + 1 >> 1;
      local_54 = local_24 + 1 >> 1;
      iVar2 = bufcopy(b_00,local_50 * local_54,buffer_00,&local_3c,iVar1);
      if (iVar2 == 0) {
        for (local_34 = 1; local_34 < local_2c; local_34 = local_34 + 1) {
          qtree_reduce(b_00,local_54,local_50,local_54,b_00);
          local_50 = local_50 + 1 >> 1;
          local_54 = local_54 + 1 >> 1;
          iVar2 = bufcopy(b_00,local_50 * local_54,buffer_00,&local_3c,iVar1);
          if (iVar2 != 0) {
            write_bdirect((char *)CONCAT44(iVar4,in_stack_ffffffffffffff90),a_00,
                          in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff7c,(uchar *)0x264240,(int)b_00);
            local_28 = local_38;
            goto LAB_002640f1;
          }
        }
        output_nybble(local_10,0xf);
        if (local_3c == 0) {
          if (bits_to_go3 < 1) {
            output_nbits(local_10,code[0],ncode[0]);
            local_28 = local_38;
          }
          else {
            output_nbits(local_10,bitbuffer & (1 << ((byte)bits_to_go3 & 0x1f)) - 1U,bits_to_go3);
            local_28 = local_38;
          }
        }
        else {
          iVar2 = local_3c;
          if (0 < bits_to_go3) {
            output_nbits(local_10,bitbuffer & (1 << ((byte)bits_to_go3 & 0x1f)) - 1U,bits_to_go3);
            iVar2 = local_3c;
          }
          while (local_30 = iVar2 + -1, local_28 = local_38, -1 < local_30) {
            output_nbits(local_10,(uint)buffer_00[local_30],8);
            iVar2 = local_30;
          }
        }
      }
      else {
        write_bdirect((char *)CONCAT44(iVar4,in_stack_ffffffffffffff90),a_00,
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                      (uchar *)0x2641a1,(int)b_00);
        local_28 = local_38;
      }
      goto LAB_002640f1;
    }
    free(buffer_00);
    free(b_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
qtree_encode(char *outfile, int a[], int n, int nqx, int nqy, int nbitplanes)
{

/*
int a[];
int n;								 physical dimension of row in a		
int nqx;							 length of row			
int nqy;							 length of column (<=n)				
int nbitplanes;						 number of bit planes to output	
*/
	
int log2n, i, k, bit, b, bmax, nqmax, nqx2, nqy2, nx, ny;
unsigned char *scratch, *buffer;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * initialize buffer point, max buffer size
	 */
	nqx2 = (nqx+1)/2;
	nqy2 = (nqy+1)/2;
	bmax = (nqx2*nqy2+1)/2;
	/*
	 * We're indexing A as a 2-D array with dimensions (nqx,nqy).
	 * Scratch is 2-D with dimensions (nqx/2,nqy/2) rounded up.
	 * Buffer is used to store string of codes for output.
	 */
	scratch = (unsigned char *) malloc(2*bmax);
	buffer = (unsigned char *) malloc(bmax);
	if ((scratch == (unsigned char *) NULL) ||
		(buffer  == (unsigned char *) NULL)) {		
		ffpmsg("qtree_encode: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	/*
	 * now encode each bit plane, starting with the top
	 */
	for (bit=nbitplanes-1; bit >= 0; bit--) {
		/*
		 * initial bit buffer
		 */
		b = 0;
		bitbuffer = 0;
		bits_to_go3 = 0;
		/*
		 * on first pass copy A to scratch array
		 */
		qtree_onebit(a,n,nqx,nqy,scratch,bit);
		nx = (nqx+1)>>1;
		ny = (nqy+1)>>1;
		/*
		 * copy non-zero values to output buffer, which will be written
		 * in reverse order
		 */
		if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
			/*
			 * quadtree is expanding data,
			 * change warning code and just fill buffer with bit-map
			 */
			write_bdirect(outfile,a,n,nqx,nqy,scratch,bit);
			goto bitplane_done;
		}
		/*
		 * do log2n reductions
		 */
		for (k = 1; k<log2n; k++) {
			qtree_reduce(scratch,ny,nx,ny,scratch);
			nx = (nx+1)>>1;
			ny = (ny+1)>>1;
			if (bufcopy(scratch,nx*ny,buffer,&b,bmax)) {
				write_bdirect(outfile,a,n,nqx,nqy,scratch,bit);
				goto bitplane_done;
			}
		}
		/*
		 * OK, we've got the code in buffer
		 * Write quadtree warning code, then write buffer in reverse order
		 */
		output_nybble(outfile,0xF);
		if (b==0) {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			} else {
				/*
				 * have to write a zero nybble if there are no 1's in array
				 */
				output_huffman(outfile,0);
			}
		} else {
			if (bits_to_go3>0) {
				/*
				 * put out the last few bits
				 */
				output_nbits(outfile, bitbuffer & ((1<<bits_to_go3)-1),
					bits_to_go3);
			}
			for (i=b-1; i>=0; i--) {
				output_nbits(outfile,buffer[i],8);
			}
		}
		bitplane_done: ;
	}
	free(buffer);
	free(scratch);
	return(0);
}